

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman.cpp
# Opt level: O2

void __thiscall CHuffman::ConstructTree(CHuffman *this,uint *pFrequencies)

{
  long lVar1;
  CHuffmanConstructNode *pCVar2;
  code *pcVar3;
  bool bVar4;
  long lVar5;
  int i;
  long lVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long in_FS_OFFSET;
  code *pcStack_1048;
  CHuffmanConstructNode *pCStack_1040;
  CHuffmanConstructNode *apNodesLeft [257];
  undefined1 auStack_82e [6];
  CHuffmanConstructNode aNodesLeftStorage [257];
  
  apNodesLeft[4] = (CHuffmanConstructNode *)0x0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar5 = 6;
  for (lVar6 = 0; lVar6 != 0x101; lVar6 = lVar6 + 1) {
    *(undefined8 *)(this->m_aNodes[0].m_aLeafs + lVar5 + -8) = 0xffffffffffffffff;
    *(char *)(this->m_aNodes[0].m_aLeafs + lVar5 + -4) = (char)lVar6;
    uVar8 = 1;
    if (lVar6 != 0x100) {
      uVar8 = pFrequencies[lVar6];
    }
    aNodesLeftStorage[lVar6].m_Frequency = uVar8;
    aNodesLeftStorage[lVar6].m_NodeId = (unsigned_short)lVar6;
    apNodesLeft[lVar6] = (CHuffmanConstructNode *)(auStack_82e + lVar5);
    lVar5 = lVar5 + 8;
  }
  lVar5 = 0x100;
  lVar6 = 0x101;
  pCStack_1040 = (CHuffmanConstructNode *)0x1;
  for (lVar7 = 0x101; lVar7 != 0x201; lVar7 = lVar7 + 1) {
    bVar4 = true;
    lVar9 = lVar5;
    while( true ) {
      lVar10 = 0;
      if (0 < lVar9) {
        lVar10 = lVar9;
      }
      if (!bVar4) break;
      bVar4 = false;
      lVar12 = 0;
      while (lVar11 = lVar12, lVar10 != lVar11) {
        pCVar2 = apNodesLeft[lVar11];
        lVar12 = lVar11 + 1;
        if (pCVar2->m_Frequency < apNodesLeft[lVar11 + 1]->m_Frequency) {
          apNodesLeft[lVar11] = apNodesLeft[lVar11 + 1];
          apNodesLeft[lVar12] = pCVar2;
          bVar4 = true;
        }
      }
      lVar9 = lVar9 + -1;
    }
    this->m_aNodes[lVar7].m_NumBits = 0;
    pCVar2 = apNodesLeft[lVar6 + -1];
    this->m_aNodes[lVar7].m_aLeafs[0] = pCVar2->m_NodeId;
    pcVar3 = (&pcStack_1048)[lVar6];
    this->m_aNodes[lVar7].m_aLeafs[1] = *(unsigned_short *)pcVar3;
    *(short *)pcVar3 = (short)lVar7;
    *(int *)(pcVar3 + 4) = *(int *)(pcVar3 + 4) + pCVar2->m_Frequency;
    lVar6 = lVar6 + -1;
    lVar5 = lVar5 + -1;
  }
  this->m_NumNodes = 0x201;
  this->m_pStartNode = this->m_aNodes + 0x200;
  pCStack_1040 = (CHuffmanConstructNode *)0x1b3af0;
  Setbits_r(this,this->m_aNodes + 0x200,0,0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  pCStack_1040 = (CHuffmanConstructNode *)Init;
  __stack_chk_fail();
}

Assistant:

void CHuffman::ConstructTree(const unsigned *pFrequencies)
{
	CHuffmanConstructNode aNodesLeftStorage[HUFFMAN_MAX_SYMBOLS];
	CHuffmanConstructNode *apNodesLeft[HUFFMAN_MAX_SYMBOLS];
	int NumNodesLeft = HUFFMAN_MAX_SYMBOLS;

	// add the symbols
	for(int i = 0; i < HUFFMAN_MAX_SYMBOLS; i++)
	{
		m_aNodes[i].m_NumBits = 0xFFFFFFFF;
		m_aNodes[i].m_Symbol = i;
		m_aNodes[i].m_aLeafs[0] = 0xffff;
		m_aNodes[i].m_aLeafs[1] = 0xffff;

		if(i == HUFFMAN_EOF_SYMBOL)
			aNodesLeftStorage[i].m_Frequency = 1;
		else
			aNodesLeftStorage[i].m_Frequency = pFrequencies[i];
		aNodesLeftStorage[i].m_NodeId = i;
		apNodesLeft[i] = &aNodesLeftStorage[i];

	}

	m_NumNodes = HUFFMAN_MAX_SYMBOLS;

	// construct the table
	while(NumNodesLeft > 1)
	{
		// we can't rely on stdlib's qsort for this, it can generate different results on different implementations
		BubbleSort(apNodesLeft, NumNodesLeft);

		m_aNodes[m_NumNodes].m_NumBits = 0;
		m_aNodes[m_NumNodes].m_aLeafs[0] = apNodesLeft[NumNodesLeft-1]->m_NodeId;
		m_aNodes[m_NumNodes].m_aLeafs[1] = apNodesLeft[NumNodesLeft-2]->m_NodeId;
		apNodesLeft[NumNodesLeft-2]->m_NodeId = m_NumNodes;
		apNodesLeft[NumNodesLeft-2]->m_Frequency = apNodesLeft[NumNodesLeft-1]->m_Frequency + apNodesLeft[NumNodesLeft-2]->m_Frequency;

		m_NumNodes++;
		NumNodesLeft--;
	}

	// set start node
	m_pStartNode = &m_aNodes[m_NumNodes-1];

	// build symbol bits
	Setbits_r(m_pStartNode, 0, 0);
}